

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_long,long>::
Update<duckdb::BitpackingCompressionState<unsigned_long,true,long>::BitpackingWriter>
          (BitpackingState<unsigned_long,long> *this,unsigned_long value,bool is_valid)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  
  lVar1 = *(long *)(this + 0x8810);
  this[lVar1 + 0x8010] = (BitpackingState<unsigned_long,long>)is_valid;
  this[0x8860] = (BitpackingState<unsigned_long,long>)((byte)this[0x8860] & is_valid);
  this[0x8861] = (BitpackingState<unsigned_long,long>)((byte)this[0x8861] & !is_valid);
  if (is_valid) {
    *(unsigned_long *)(*(long *)(this + 0x4008) + lVar1 * 8) = value;
    uVar3 = *(ulong *)(this + 0x8828);
    if (value <= *(ulong *)(this + 0x8828)) {
      uVar3 = value;
    }
    *(ulong *)(this + 0x8828) = uVar3;
    if (value < *(ulong *)(this + 0x8830)) {
      value = *(ulong *)(this + 0x8830);
    }
    *(unsigned_long *)(this + 0x8830) = value;
  }
  lVar1 = *(long *)(this + 0x8810);
  *(long *)(this + 0x8810) = lVar1 + 1;
  if (lVar1 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<unsigned_long,true,long>::BitpackingWriter>
                      (this);
    *(undefined8 *)(this + 0x8828) = 0xffffffffffffffff;
    *(undefined8 *)(this + 0x8840) = 0x7fffffffffffffff;
    *(undefined8 *)(this + 0x8830) = 0;
    *(undefined8 *)(this + 0x8838) = 0;
    *(undefined8 *)(this + 0x8848) = 0x8000000000000000;
    *(undefined4 *)(this + 0x8860) = 0x101;
    *(undefined8 *)(this + 0x8810) = 0;
    *(undefined8 *)(this + 0x8850) = 0;
    *(undefined8 *)(this + 0x8858) = 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}